

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_base.cpp
# Opt level: O1

void __thiscall
Base_column_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>
::test_method(Base_column_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>
              *this)

{
  Row_container rows;
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
  matrix;
  Column_settings settings;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
  local_68;
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
  local_48;
  Column_settings local_30;
  
  local_68.
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&local_30.operators,5);
  build_column_matrix<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>>>>>
            (&local_48,&local_68,&local_30);
  column_test_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,false>>>>>>>>
            (&local_48,&local_68);
  std::
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>
  ::~vector(&local_48);
  if (local_30.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Base_z5_column_content_access, Column, z5_no_row_access_columns) {
  typename Column::Column_settings settings(5);
  std::vector<Column> matrix = build_column_matrix<Column>(settings);
  column_test_common_z5_content_access(matrix);
}